

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::
tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::attempt_remove_missing_keys<int>
          (tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,initializer_list<int> absent_keys)

{
  bool bVar1;
  const_iterator piVar2;
  size_type sVar3;
  char *pcVar4;
  key_type key;
  initializer_list<int> *local_110;
  AssertHelper local_100;
  Message local_f8;
  size_t local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_c0;
  Message local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  undefined1 local_70 [24];
  size_type remove_result;
  key_type k;
  int absent_key;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<int> *__range3;
  size_t mem_use_before;
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  initializer_list<int> absent_keys_local;
  
  absent_keys_local._M_array = (iterator)absent_keys._M_len;
  this_local = (tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                *)absent_keys._M_array;
  mem_use_before = (size_t)this;
  if ((this->parallel_test & 1U) == 0) {
    local_110 = (initializer_list<int> *)
                db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                ::get_current_memory_use(&this->test_db);
  }
  else {
    local_110 = (initializer_list<int> *)0x0;
  }
  __range3 = local_110;
  __end0 = std::initializer_list<int>::begin((initializer_list<int> *)&this_local);
  piVar2 = std::initializer_list<int>::end((initializer_list<int> *)&this_local);
  while( true ) {
    if (__end0 == piVar2) {
      return;
    }
    k._M_extent._M_extent_value._4_4_ = *__end0;
    _remove_result = coerce_key<int>(this,k._M_extent._M_extent_value._4_4_);
    key._M_extent._M_extent_value = remove_result;
    key._M_ptr = (pointer)this;
    to_ikey((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             *)local_70,key);
    sVar3 = std::
            map<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::test::tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            ::erase(&this->values,(key_type *)local_70);
    std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>::~shared_ptr
              ((shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_> *)local_70);
    local_ac = 0;
    local_70._16_8_ = sVar3;
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_a8,"(remove_result)","(0)",(unsigned_long *)(local_70 + 0x10),
               &local_ac);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x22d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      testing::Message::~Message(&local_b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    if (!bVar1) break;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )remove_result;
    tree_verifier<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
    ::
    do_try_remove_missing_key<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,std::span<std::byte_const,18446744073709551615ul>>
              ((tree_verifier<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                *)this,_remove_result);
    if ((this->parallel_test & 1U) == 0) {
      local_f0 = db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                 ::get_current_memory_use(&this->test_db);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_e8,"(mem_use_before)","(test_db.get_current_memory_use())",
                 (unsigned_long *)&__range3,&local_f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
      if (!bVar1) {
        testing::Message::Message(&local_f8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                   ,0x231,pcVar4);
        testing::internal::AssertHelper::operator=(&local_100,&local_f8);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        testing::Message::~Message(&local_f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
      if (!bVar1) {
        return;
      }
    }
    __end0 = __end0 + 1;
  }
  return;
}

Assistant:

void attempt_remove_missing_keys(std::initializer_list<T> absent_keys) {
#ifdef UNODB_DETAIL_WITH_STATS
    const auto mem_use_before =
        parallel_test ? 0 : test_db.get_current_memory_use();
#endif  // UNODB_DETAIL_WITH_STATS

    for (const auto absent_key : absent_keys) {
      const auto k{coerce_key(absent_key)};

      const auto remove_result = values.erase(to_ikey(k));
      UNODB_ASSERT_EQ(remove_result, 0);
      do_try_remove_missing_key(k);
#ifdef UNODB_DETAIL_WITH_STATS
      if (!parallel_test) {
        UNODB_ASSERT_EQ(mem_use_before, test_db.get_current_memory_use());
      }
#endif  // UNODB_DETAIL_WITH_STATS
    }
  }